

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O0

bool __thiscall
irr::scene::CAnimatedMeshSceneNode::setFrameLoop(CAnimatedMeshSceneNode *this,s32 begin,s32 end)

{
  s32 sVar1;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  s32 maxFrameCount;
  s32 in_stack_ffffffffffffffdc;
  
  (**(code **)(*(long *)in_RDI[0x23] + 0x50))();
  sVar1 = (s32)((ulong)in_RDI >> 0x20);
  if (in_EDX < in_ESI) {
    sVar1 = core::s32_clamp(sVar1,(s32)in_RDI,in_stack_ffffffffffffffdc);
    *(s32 *)(in_RDI + 0x24) = sVar1;
    sVar1 = core::s32_clamp((s32)((ulong)in_RDI >> 0x20),(s32)in_RDI,in_stack_ffffffffffffffdc);
    *(s32 *)((long)in_RDI + 0x124) = sVar1;
  }
  else {
    sVar1 = core::s32_clamp(sVar1,(s32)in_RDI,in_stack_ffffffffffffffdc);
    *(s32 *)(in_RDI + 0x24) = sVar1;
    sVar1 = core::s32_clamp((s32)((ulong)in_RDI >> 0x20),(s32)in_RDI,in_stack_ffffffffffffffdc);
    *(s32 *)((long)in_RDI + 0x124) = sVar1;
  }
  if (0.0 < *(float *)(in_RDI + 0x25) || *(float *)(in_RDI + 0x25) == 0.0) {
    (**(code **)(*in_RDI + 0x120))((float)(int)in_RDI[0x24]);
  }
  else {
    (**(code **)(*in_RDI + 0x120))((float)*(int *)((long)in_RDI + 0x124));
  }
  return true;
}

Assistant:

bool CAnimatedMeshSceneNode::setFrameLoop(s32 begin, s32 end)
{
	const s32 maxFrameCount = Mesh->getFrameCount() - 1;
	if (end < begin) {
		StartFrame = core::s32_clamp(end, 0, maxFrameCount);
		EndFrame = core::s32_clamp(begin, StartFrame, maxFrameCount);
	} else {
		StartFrame = core::s32_clamp(begin, 0, maxFrameCount);
		EndFrame = core::s32_clamp(end, StartFrame, maxFrameCount);
	}
	if (FramesPerSecond < 0)
		setCurrentFrame((f32)EndFrame);
	else
		setCurrentFrame((f32)StartFrame);

	return true;
}